

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O1

void b2CollidePolygons(cbtManifoldResult *manifold,cbtBox2dShape *polyA,cbtTransform *xfA,
                      cbtBox2dShape *polyB,cbtTransform *xfB)

{
  cbtVector3 *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  float fVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  cbtScalar cVar14;
  float fVar15;
  cbtScalar cVar16;
  cbtScalar cVar17;
  float fVar18;
  cbtScalar cVar19;
  cbtScalar cVar20;
  float fVar21;
  cbtScalar cVar22;
  cbtScalar cVar23;
  cbtScalar cVar24;
  cbtScalar cVar25;
  float fVar26;
  undefined8 uVar27;
  int iVar28;
  cbtTransform *pcVar29;
  undefined1 auVar30 [16];
  cbtVector3 cVar31;
  cbtManifoldResult *pcVar32;
  int iVar33;
  cbtBox2dShape *pcVar34;
  int *piVar35;
  ulong uVar36;
  int iVar37;
  cbtScalar *pcVar38;
  ulong uVar39;
  int i;
  long lVar40;
  cbtVector3 *pcVar41;
  ClipVertex *vOut;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  cbtScalar cVar50;
  float fVar51;
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  cbtVector3 sideNormal;
  int edgeB;
  int edgeA;
  ClipVertex incidentEdge [2];
  cbtVector3 cStack_188;
  float local_174;
  float local_170;
  cbtScalar local_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  cbtScalar local_148 [4];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  cbtManifoldResult *local_118;
  int local_110 [2];
  cbtVector3 local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 uStack_c0;
  ClipVertex local_b8;
  cbtScalar local_a4 [4];
  ClipVertex local_88;
  undefined1 local_74 [16];
  ClipVertex local_58;
  cbtScalar local_44 [4];
  
  local_110[1] = 0;
  cVar50 = FindMaxSeparation(local_110 + 1,polyA,xfA,polyB,xfB);
  if (cVar50 <= 0.0) {
    local_110[0] = 0;
    local_118 = manifold;
    local_16c = FindMaxSeparation(local_110,polyB,xfB,polyA,xfA);
    pcVar32 = local_118;
    if (local_16c <= 0.0) {
      auVar44 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f7ae148),0),ZEXT416((uint)cVar50),
                                ZEXT416(0x3a83126f));
      local_170 = auVar44._0_4_;
      pcVar34 = polyA;
      pcVar29 = xfA;
      if (local_16c <= local_170) {
        pcVar34 = polyB;
        pcVar29 = xfB;
        xfB = xfA;
      }
      local_148[0] = (xfB->m_origin).m_floats[2];
      fVar2 = (xfB->m_origin).m_floats[1];
      fVar3 = (xfB->m_origin).m_floats[0];
      cVar50 = (xfB->m_basis).m_el[2].m_floats[2];
      fVar4 = (xfB->m_basis).m_el[2].m_floats[1];
      cVar5 = (xfB->m_basis).m_el[2].m_floats[0];
      cVar6 = (xfB->m_basis).m_el[1].m_floats[2];
      fVar7 = (xfB->m_basis).m_el[1].m_floats[1];
      cVar8 = (xfB->m_basis).m_el[1].m_floats[0];
      cVar9 = (xfB->m_basis).m_el[0].m_floats[2];
      cVar10 = (xfB->m_basis).m_el[0].m_floats[0];
      fVar11 = (xfB->m_basis).m_el[0].m_floats[1];
      fVar51 = (pcVar29->m_origin).m_floats[2];
      fVar12 = (pcVar29->m_origin).m_floats[1];
      fVar13 = (pcVar29->m_origin).m_floats[0];
      cVar14 = (pcVar29->m_basis).m_el[0].m_floats[0];
      fVar15 = (pcVar29->m_basis).m_el[0].m_floats[1];
      cVar16 = (pcVar29->m_basis).m_el[0].m_floats[2];
      cVar17 = (pcVar29->m_basis).m_el[1].m_floats[0];
      fVar18 = (pcVar29->m_basis).m_el[1].m_floats[1];
      cVar19 = (pcVar29->m_basis).m_el[1].m_floats[2];
      cVar20 = (pcVar29->m_basis).m_el[2].m_floats[0];
      fVar21 = (pcVar29->m_basis).m_el[2].m_floats[1];
      cVar22 = (pcVar29->m_basis).m_el[2].m_floats[2];
      piVar35 = local_110;
      if (local_16c <= local_170) {
        piVar35 = local_110 + 1;
      }
      iVar33 = *piVar35;
      if (local_16c <= local_170) {
        polyB = polyA;
      }
      cVar23 = polyB->m_normals[iVar33].m_floats[0];
      cVar24 = polyB->m_normals[iVar33].m_floats[1];
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)cVar24));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar10),ZEXT416((uint)cVar23));
      cVar25 = polyB->m_normals[iVar33].m_floats[2];
      auVar45 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar9),ZEXT416((uint)cVar25));
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)cVar24));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar8),ZEXT416((uint)cVar23));
      auVar46 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar6),ZEXT416((uint)cVar25));
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)cVar24));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar5),ZEXT416((uint)cVar23));
      auVar47 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar50),ZEXT416((uint)cVar25));
      auVar44 = vmulss_avx512f(ZEXT416((uint)cVar17),auVar46);
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar14),auVar45);
      auVar48 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar20),auVar47);
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar18),auVar46);
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar15),auVar45);
      auVar49 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)fVar21),auVar47);
      auVar44 = vmulss_avx512f(ZEXT416((uint)cVar19),auVar46);
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar16),auVar45);
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar22),auVar47);
      pcVar38 = pcVar34->m_normals[0].m_floats + 2;
      uVar39 = 0;
      bVar42 = false;
      uVar36 = 0;
      bVar43 = true;
      do {
        auVar45 = vmulss_avx512f(auVar49,ZEXT416((uint)pcVar38[-1]));
        auVar45 = vfmadd231ss_avx512f(auVar45,auVar48,
                                      ZEXT416((uint)((cbtVector3 *)(pcVar38 + -2))->m_floats[0]));
        auVar46 = vfmadd231ss_avx512f(auVar45,auVar44,ZEXT416((uint)*pcVar38));
        auVar45 = vucomiss_avx512f(auVar46);
        vminss_avx512f(auVar46,auVar45);
        if (!bVar42 && !bVar43) {
          uVar36 = uVar39 & 0xffffffff;
        }
        uVar39 = uVar39 + 1;
        pcVar38 = pcVar38 + 4;
        bVar42 = uVar39 < 4;
        bVar43 = uVar39 == 4;
      } while (!bVar43);
      iVar28 = (int)uVar36;
      iVar37 = 0;
      if (iVar28 < 3) {
        iVar37 = iVar28 + 1;
      }
      cVar23 = pcVar34->m_vertices[iVar28].m_floats[0];
      fVar26 = pcVar34->m_vertices[iVar28].m_floats[1];
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar26)),ZEXT416((uint)cVar23),
                                ZEXT416((uint)cVar14));
      cVar24 = pcVar34->m_vertices[iVar28].m_floats[2];
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar24),ZEXT416((uint)cVar16));
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar18),ZEXT416((uint)fVar26));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar23),ZEXT416((uint)cVar17));
      auVar46 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar24),ZEXT416((uint)cVar19));
      auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar21)),ZEXT416((uint)cVar20),
                                ZEXT416((uint)cVar23));
      auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar22),ZEXT416((uint)cVar24));
      auVar46 = vaddss_avx512f(ZEXT416((uint)fVar12),auVar46);
      auVar44 = vinsertps_avx(ZEXT416((uint)(auVar44._0_4_ + fVar13)),auVar46,0x10);
      local_88.v.m_floats =
           (cbtScalar  [4])vinsertps_avx(auVar44,ZEXT416((uint)(auVar45._0_4_ + fVar51)),0x28);
      cVar23 = pcVar34->m_vertices[iVar37].m_floats[0];
      fVar26 = pcVar34->m_vertices[iVar37].m_floats[1];
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar26)),ZEXT416((uint)cVar23),
                                ZEXT416((uint)cVar14));
      cVar14 = pcVar34->m_vertices[iVar37].m_floats[2];
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cVar14),ZEXT416((uint)cVar16));
      auVar45 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * fVar26)),ZEXT416((uint)cVar23),
                                ZEXT416((uint)cVar17));
      auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)cVar14),ZEXT416((uint)cVar19));
      auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar21)),ZEXT416((uint)cVar23),
                                ZEXT416((uint)cVar20));
      auVar46 = vfmadd231ss_fma(auVar46,ZEXT416((uint)cVar14),ZEXT416((uint)cVar22));
      auVar44 = vinsertps_avx(ZEXT416((uint)(auVar44._0_4_ + fVar13)),
                              ZEXT416((uint)(auVar45._0_4_ + fVar12)),0x10);
      local_74 = vinsertps_avx(auVar44,ZEXT416((uint)(fVar51 + auVar46._0_4_)),0x28);
      pcVar1 = polyB->m_vertices + (long)iVar33 + 1;
      local_138._8_8_ = 0;
      local_138._0_8_ = *(ulong *)pcVar1[-1].m_floats;
      pcVar41 = polyB->m_vertices;
      if (iVar33 < 3) {
        pcVar41 = pcVar1;
      }
      local_d8._8_8_ = 0;
      local_d8._0_8_ = *(ulong *)pcVar41->m_floats;
      local_c8 = *(undefined8 *)(pcVar41->m_floats + 2);
      local_e8 = vmovshdup_avx(local_d8);
      local_168._0_4_ = pcVar1[-1].m_floats[2];
      fVar51 = (float)*(ulong *)pcVar41->m_floats - (float)*(ulong *)pcVar1[-1].m_floats;
      local_158 = vmovshdup_avx(local_138);
      fVar12 = local_e8._0_4_ - local_158._0_4_;
      uStack_c0 = 0;
      fVar13 = (float)local_c8 - (float)local_168._0_4_;
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar11),ZEXT416((uint)fVar12));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar10),ZEXT416((uint)fVar51));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar9),ZEXT416((uint)fVar13));
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar7),ZEXT416((uint)fVar12));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar8),ZEXT416((uint)fVar51));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar6),ZEXT416((uint)fVar13));
      auVar44 = vinsertps_avx(auVar44,auVar45,0x10);
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar12));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar5),ZEXT416((uint)fVar51));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar50),ZEXT416((uint)fVar13));
      cStack_188.m_floats = (cbtScalar  [4])vinsertps_avx(auVar44,auVar45,0x28);
      cVar14 = cStack_188.m_floats[0];
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(cStack_188.m_floats[1] * cStack_188.m_floats[1])),
                                ZEXT416((uint)cStack_188.m_floats[0]),
                                ZEXT416((uint)cStack_188.m_floats[0]));
      cVar16 = cStack_188.m_floats[2];
      auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)cStack_188.m_floats[2]),
                                ZEXT416((uint)cStack_188.m_floats[2]));
      if (auVar44._0_4_ < 0.0) {
        local_128._0_4_ = cStack_188.m_floats[1];
        fVar51 = sqrtf(auVar44._0_4_);
        cVar17 = local_148[0];
      }
      else {
        auVar44 = vsqrtss_avx(auVar44,auVar44);
        fVar51 = auVar44._0_4_;
        local_128._0_4_ = cStack_188.m_floats[1];
        cVar17 = local_148[0];
      }
      cVar31.m_floats = cStack_188.m_floats;
      fVar51 = 1.0 / fVar51;
      cStack_188.m_floats[0] = cVar14 * fVar51;
      cStack_188.m_floats[1] = (float)local_128._0_4_ * fVar51;
      cStack_188.m_floats[2] = cVar16 * fVar51;
      cStack_188.m_floats[3] = cVar31.m_floats[3];
      auVar49._0_4_ = -cStack_188.m_floats[0];
      auVar49._4_4_ = 0x80000000;
      auVar49._8_4_ = 0x80000000;
      auVar49._12_4_ = 0x80000000;
      auVar44 = vmulss_avx512f(ZEXT416((uint)fVar11),local_158);
      auVar44 = vfmadd231ss_avx512f(auVar44,local_138,ZEXT416((uint)cVar10));
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)local_168._0_4_),ZEXT416((uint)cVar9));
      auVar45 = vmulss_avx512f(ZEXT416((uint)fVar7),local_158);
      auVar45 = vfmadd231ss_avx512f(auVar45,local_138,ZEXT416((uint)cVar8));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)local_168._0_4_),ZEXT416((uint)cVar6));
      auVar46 = vmulss_avx512f(ZEXT416((uint)fVar4),local_158);
      auVar46 = vfmadd231ss_avx512f(auVar46,local_138,ZEXT416((uint)cVar5));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416((uint)cVar50),ZEXT416((uint)local_168._0_4_));
      auVar47 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar44);
      auVar44 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar45);
      auVar46 = vaddss_avx512f(ZEXT416((uint)cVar17),auVar46);
      local_b8.v.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x20);
      local_174 = auVar44._0_4_;
      local_158 = ZEXT416((uint)cStack_188.m_floats[0]);
      auVar44 = vfmadd231ss_fma(ZEXT416((uint)(cStack_188.m_floats[1] * local_174)),local_158,
                                auVar47);
      local_128 = ZEXT416((uint)cStack_188.m_floats[2]);
      auVar45 = vfmadd231ss_fma(auVar44,local_128,auVar46);
      local_f8._0_4_ = -cStack_188.m_floats[1];
      local_f8._4_4_ = 0x80000000;
      local_f8._8_4_ = 0x80000000;
      local_f8._12_4_ = 0x80000000;
      auVar48._0_8_ = CONCAT44(0x80000000,cStack_188.m_floats[2]) ^ 0x80000000;
      auVar48._8_4_ = 0x80000000;
      auVar48._12_4_ = 0x80000000;
      auVar44 = vunpcklps_avx(auVar49,local_f8);
      local_108.m_floats = (cbtScalar  [4])vinsertps_avx(auVar44,auVar48,0x28);
      local_168 = ZEXT416((uint)cStack_188.m_floats[1]);
      local_138 = auVar49;
      local_a4 = local_b8.v.m_floats;
      local_58.v.m_floats = local_b8.v.m_floats;
      local_44 = local_b8.v.m_floats;
      iVar33 = ClipSegmentToLine(&local_58,&local_88,&local_108,-auVar45._0_4_);
      if (1 < iVar33) {
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar10),local_d8,
                                  ZEXT416((uint)((float)local_e8._0_4_ * fVar11)));
        auVar30._8_8_ = uStack_c0;
        auVar30._0_8_ = local_c8;
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar9),auVar30,auVar44);
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar8),local_d8,
                                  ZEXT416((uint)((float)local_e8._0_4_ * fVar7)));
        auVar45 = vfmadd213ss_fma(ZEXT416((uint)cVar6),auVar30,auVar45);
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)((auVar45._0_4_ + fVar2) * (float)local_168._0_4_)),
                                  ZEXT416((uint)(auVar44._0_4_ + fVar3)),
                                  ZEXT416((uint)local_158._0_4_));
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar5),local_d8,
                                  ZEXT416((uint)((float)local_e8._0_4_ * fVar4)));
        auVar44 = vfmadd213ss_fma(ZEXT416((uint)cVar50),auVar30,auVar44);
        auVar44 = vfmadd132ss_fma(ZEXT416((uint)(auVar44._0_4_ + local_148[0])),auVar45,
                                  ZEXT416((uint)local_128._0_4_));
        vOut = &local_b8;
        iVar33 = ClipSegmentToLine(vOut,&local_58,&cStack_188,auVar44._0_4_);
        auVar53 = ZEXT1664(local_168);
        if ((1 < iVar33) && (0 < b2_maxManifoldPoints)) {
          auVar44 = vfmsub213ss_fma(ZEXT416(auVar47._0_4_),local_168,
                                    ZEXT416((uint)(local_158._0_4_ * local_174)));
          if (local_16c <= local_170) {
            auVar45 = vinsertps_avx(local_168,ZEXT416((uint)local_138._0_4_),0x10);
          }
          else {
            auVar45 = vinsertps_avx(local_f8,local_158,0x10);
          }
          auVar44 = vfmadd132ss_fma(ZEXT416(0),auVar44,ZEXT416(auVar46._0_4_));
          uVar27 = vcmpss_avx512f(ZEXT416((uint)local_170),ZEXT416((uint)local_16c),5);
          auVar46._8_4_ = 0x80000000;
          auVar46._0_8_ = 0x8000000080000000;
          auVar46._12_4_ = 0x80000000;
          auVar46 = vxorps_avx512vl(auVar45,auVar46);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
          auVar47._4_12_ = SUB1612(auVar45 << 0x40,4);
          auVar47._0_4_ = (uint)((byte)uVar27 & 1) * -0x80000000;
          local_148 = (cbtScalar  [4])vmovlhps_avx(auVar46,auVar47);
          lVar40 = 0;
          auVar52 = ZEXT464(0) << 0x20;
          do {
            auVar45 = vfmadd231ss_fma(ZEXT416((uint)((float)local_138._0_4_ * (vOut->v).m_floats[1])
                                             ),auVar53._0_16_,ZEXT416((uint)(vOut->v).m_floats[0]));
            auVar45 = vfmadd231ss_fma(auVar45,auVar52._0_16_,ZEXT416((uint)(vOut->v).m_floats[2]));
            if (auVar45._0_4_ - auVar44._0_4_ <= 0.0) {
              local_108.m_floats[0] = local_148[0];
              local_108.m_floats[1] = local_148[1];
              local_108.m_floats[2] = local_148[2];
              local_108.m_floats[3] = local_148[3];
              (*(pcVar32->super_Result)._vptr_Result[4])(pcVar32,&local_108,vOut);
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar53 = ZEXT1664(local_168);
            }
            lVar40 = lVar40 + 1;
            vOut = vOut + 1;
          } while (lVar40 < b2_maxManifoldPoints);
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(cbtManifoldResult* manifold,
					   const cbtBox2dShape* polyA, const cbtTransform& xfA,
					   const cbtBox2dShape* polyB, const cbtTransform& xfB)
{
	int edgeA = 0;
	cbtScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	cbtScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const cbtBox2dShape* poly1;  // reference poly
	const cbtBox2dShape* poly2;  // incident poly
	cbtTransform xf1, xf2;
	int edge1;  // reference edge
	unsigned char flip;
	const cbtScalar k_relativeTol = 0.98f;
	const cbtScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const cbtVector3* vertices1 = poly1->getVertices();

	cbtVector3 v11 = vertices1[edge1];
	cbtVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1 + 1] : vertices1[0];

	//cbtVector3 dv = v12 - v11;
	cbtVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	cbtVector3 frontNormal = cbtCrossS(sideNormal, 1.0f);

	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	cbtScalar frontOffset = b2Dot(frontNormal, v11);
	cbtScalar sideOffset1 = -b2Dot(sideNormal, v11);
	cbtScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0, 0, 0);
	clipPoints1[1].v.setValue(0, 0, 0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0, 0, 0);
	clipPoints2[1].v.setValue(0, 0, 0);

	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1, sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	cbtVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		cbtScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//cbtScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal, clipPoints2[i].v, separation);

			//			cp->id = clipPoints2[i].id;
			//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

	//	manifold->pointCount = pointCount;}
}